

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

double StrToD16(char *str,int flags,double empty_string_value,int *processed_characters_count,
               bool *processed_all,char char_separator,uc16 separator)

{
  char cVar1;
  double dVar2;
  undefined4 in_register_00000034;
  int i;
  long lVar3;
  uc16 str16 [256];
  StringToDoubleConverter local_248;
  uc16 local_218 [256];
  
  lVar3 = 0;
  do {
    cVar1 = str[lVar3];
    if ((short)cVar1 == 0x40) {
      local_218[lVar3] = 0x202f;
    }
    else {
      local_218[lVar3] = (short)cVar1;
      if (cVar1 == '\0') {
        local_248.flags_ = 0x99;
        local_248.junk_string_value_ = NAN;
        local_248.infinity_symbol_ = (char *)0x0;
        local_248.nan_symbol_ = (char *)0x0;
        local_248.separator_ = 0x202f;
        local_248.empty_string_value_ = empty_string_value;
        dVar2 = double_conversion::StringToDoubleConverter::StringToDouble
                          (&local_248,local_218,(int)lVar3,
                           (int *)CONCAT44(in_register_00000034,flags));
        *(bool *)processed_characters_count =
             *(int *)CONCAT44(in_register_00000034,flags) == (int)lVar3;
        return dVar2;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static double StrToD16(const char* str, int flags,
                       double empty_string_value,
                       int* processed_characters_count, bool* processed_all,
                       char char_separator, uc16 separator) {
  uc16 str16[256];
  int length = -1;
  for (int i = 0;; i++) {
    if (str[i] == char_separator) {
            str16[i] = separator;
    } else {
            str16[i] = str[i];
    }
    if (str[i] == '\0') {
      length = i;
      break;
    }
  }
  DOUBLE_CONVERSION_ASSERT(length < 256);
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result =
      converter.StringToDouble(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}